

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# watch_list.h
# Opt level: O0

void watch_list_grow(watch_list *wl)

{
  watcher *pwVar1;
  uint local_24;
  watcher *watchers;
  uint new_size;
  watch_list *wl_local;
  
  if (wl->cap < 4) {
    local_24 = 4;
  }
  else {
    local_24 = (wl->cap >> 1) * 3;
  }
  pwVar1 = (watcher *)realloc(wl->watchers,(ulong)local_24 << 3);
  if (pwVar1 == (watcher *)0x0) {
    printf("Failed to realloc memory from %.1f MB to %.1f MB.\n",
           (double)wl->cap * 9.5367431640625e-07,((double)local_24 * 1.0) / 1048576.0);
    fflush(_stdout);
  }
  else {
    wl->watchers = pwVar1;
    wl->cap = local_24;
  }
  return;
}

Assistant:

static inline void watch_list_grow(struct watch_list *wl)
{
    unsigned new_size = (wl->cap < 4) ? 4 : (wl->cap / 2) * 3;
    struct watcher *watchers =
        satoko_realloc(struct watcher, wl->watchers, new_size);
    if (watchers == NULL) {
        printf("Failed to realloc memory from %.1f MB to %.1f "
               "MB.\n",
               1.0 * wl->cap / (1 << 20),
               1.0 * new_size / (1 << 20));
        fflush(stdout);
        return;
    }
    wl->watchers = watchers;
    wl->cap = new_size;
}